

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::PrintValue<pstore::uuid,void>(uuid *container,ostream *os)

{
  long lVar1;
  
  std::operator<<(os,'{');
  lVar1 = 0;
  do {
    if (lVar1 != 0) {
      if (lVar1 == 0x10) {
        std::operator<<(os,' ');
        std::operator<<(os,'}');
        return;
      }
      std::operator<<(os,',');
    }
    std::operator<<(os,' ');
    UniversalPrinter<unsigned_char>::Print((container->data_)._M_elems + lVar1,os);
    lVar1 = lVar1 + 1;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }